

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.h
# Opt level: O1

uint16_t eia608_from_basicna(uint16_t bna1,uint16_t bna2)

{
  if ((bna2 & 0x6000) == 0 || (bna1 & 0x6000) == 0) {
    return 0;
  }
  return CONCAT11(eia608_parity_table[bna1 >> 8 & 0x7f],eia608_parity_table[bna2 >> 8 & 0x7f]);
}

Assistant:

static inline int eia608_is_basicna(uint16_t cc_data) { return 0x0000 != (0x6000 & cc_data); /*&& 0x1F00 < (0x7F00 & cc_data);*/ }